

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChVector.h
# Opt level: O2

double chrono::VangleRX<double>(ChVector<double> *va)

{
  double dVar1;
  ChVector<double> local_38;
  ChVector<double> local_20;
  
  local_20.m_data[0] = 0.0;
  local_20.m_data[1] = va->m_data[1];
  local_20.m_data[2] = va->m_data[2];
  Vnorm<double>(&local_38,&local_20);
  dVar1 = 0.0;
  if ((local_38.m_data[0] != 1.0) || (NAN(local_38.m_data[0]))) {
    dVar1 = acos(local_38.m_data[1]);
  }
  return dVar1;
}

Assistant:

double VangleRX(const ChVector<RealA>& va) {
    Vector vproj;
    vproj.x() = 0;
    vproj.y() = va.y();
    vproj.z() = va.z();
    vproj = Vnorm(vproj);
    if (vproj.x() == 1)
        return 0;
    return acos(vproj.y());
}